

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O3

longdouble * __thiscall
TPZStack<long_double,_10>::Pop(longdouble *__return_storage_ptr__,TPZStack<long_double,_10> *this)

{
  long lVar1;
  long lVar2;
  longdouble *plVar3;
  
  lVar2 = *(long *)(__return_storage_ptr__ + 1);
  lVar1 = lVar2 + -1;
  *(long *)(__return_storage_ptr__ + 1) = lVar1;
  if (0 < lVar2) {
    return (longdouble *)(lVar1 * 0x10);
  }
  *(undefined8 *)(__return_storage_ptr__ + 1) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZStack popping beyond the stack object",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  plVar3 = (longdouble *)std::ostream::flush();
  return plVar3;
}

Assistant:

T TPZStack<T, NumExtAlloc>::Pop() {
	this->fNElements--;
	if(this->fNElements <0){
		this->fNElements = 0;
		PZError << "TPZStack popping beyond the stack object" << std::endl;
		PZError.flush();
		T temp(0);
		return temp;
	}
	return this->fStore[this->fNElements];
}